

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O3

void window_translate_coordinates_proc
               (Am_Object *obj,Am_Object *param_2,int in_x,int in_y,int *out_x,int *out_y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object owner;
  Am_Object local_40;
  Am_Object local_38;
  
  Am_Object::Get_Object(&local_38,(Am_Slot_Key)obj,10);
  Am_Object::Am_Object(&local_40,&Am_Window);
  bVar1 = Am_Object::Is_Instance_Of(&local_38,&local_40);
  Am_Object::~Am_Object(&local_40);
  if (bVar1) {
    pAVar4 = Am_Object::Get(obj,100,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    *out_x = iVar2 + in_x;
    pAVar4 = Am_Object::Get(obj,0x65,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    *out_y = iVar2 + in_y;
  }
  else {
    pAVar4 = Am_Object::Get(obj,100,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = Am_Object::Get(obj,0x7a,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    *out_x = iVar2 + in_x + iVar3;
    pAVar4 = Am_Object::Get(obj,0x65,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = Am_Object::Get(obj,0x7b,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    *out_y = iVar2 + in_y + iVar3;
    Am_Object::Get(obj,0x79,0);
  }
  Am_Object::~Am_Object(&local_38);
  return;
}

Assistant:

Am_Define_Method(Am_Translate_Coordinates_Method, void,
                 window_translate_coordinates,
                 (const Am_Object &obj, const Am_Object & /*for_part*/,
                  int in_x, int in_y, int &out_x, int &out_y))
{
  Am_Object owner = obj.Get_Owner(Am_NO_DEPENDENCY);
  if (owner.Is_Instance_Of(Am_Window)) { // sub window
    out_x = in_x + (int)obj.Get(Am_LEFT);
    out_y = in_y + (int)obj.Get(Am_TOP);
  } else {
    // compute out_x/y from slots, not from drawonable
    out_x = in_x + (int)obj.Get(Am_LEFT) + (int)obj.Get(Am_LEFT_BORDER_WIDTH);
    out_y = in_y + (int)obj.Get(Am_TOP) + (int)obj.Get(Am_TOP_BORDER_WIDTH);

    //get this always in case this is called from a formula so the
    //translate-coords will be called when the border changes which
    //might happen due to a frame_resize message from gem.
    obj.Get(Am_OMIT_TITLE_BAR);

    /* eab 6/16/97 removed reliance on drawonable
    //// HACK: This code forces the drawonable to be in the most up to date
    //// state.  It will only work for top level windows.  (And may have
    //// problems with top-level windows, too.)  The best implementation for
    //// this is to be able to calculate the position without needing a
    //// drawonable at all.
    Am_Drawonable* drawonable =
      Am_Drawonable::Narrow (obj.Get (Am_DRAWONABLE, Am_NO_DEPENDENCY));
    if (drawonable) {
      int left_border, top_border, right_border, bottom_border;
      int outer_left, outer_top;
      drawonable->Inquire_Window_Borders(left_border, top_border,
                                         right_border, bottom_border,
                                         outer_left, outer_top);
      out_x = in_x + left_border + outer_left;
      out_y = in_y + top_border + outer_top;
    } else {
      obj.Get (Am_DRAWONABLE); // Set a dependency in case drawonable appears later
      out_x = 0;
      out_y = 0;
    }
    */
  }
}